

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pod_vector.h
# Opt level: O2

void __thiscall
bk_lib::pod_vector<Clasp::Solver_*,_std::allocator<Clasp::Solver_*>_>::reserve
          (pod_vector<Clasp::Solver_*,_std::allocator<Clasp::Solver_*>_> *this,size_type n)

{
  pointer __src;
  Solver **__dest;
  
  if ((this->ebo_).cap < n) {
    __dest = __gnu_cxx::new_allocator<Clasp::Solver_*>::allocate
                       ((new_allocator<Clasp::Solver_*> *)this,(ulong)n,(void *)0x0);
    __src = (this->ebo_).buf;
    if (__src != (pointer)0x0) {
      memcpy(__dest,__src,(ulong)(this->ebo_).size << 3);
    }
    ebo::release(&this->ebo_);
    (this->ebo_).buf = __dest;
    (this->ebo_).cap = n;
  }
  return;
}

Assistant:

void reserve(size_type n) {
		if (n > capacity()) {
			T* temp = ebo_.allocate(n);
			if (ebo_.buf) {
				std::memcpy(temp, ebo_.buf, size()*sizeof(T));
			}
			ebo_.release();
			ebo_.buf = temp;
			ebo_.cap = n;
		}
	}